

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irStatement *
new_ir_seq(Context_conflict *ctx,MOJOSHADER_irStatement *first,MOJOSHADER_irStatement *next)

{
  MOJOSHADER_irStatement *pMVar1;
  
  if (first == (MOJOSHADER_irStatement *)0x0 && next == (MOJOSHADER_irStatement *)0x0) {
    __assert_fail("(first != NULL) || (next != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1285,
                  "MOJOSHADER_irStatement *new_ir_seq(Context *, MOJOSHADER_irStatement *, MOJOSHADER_irStatement *)"
                 );
  }
  pMVar1 = next;
  if ((first != (MOJOSHADER_irStatement *)0x0) &&
     (pMVar1 = first, next != (MOJOSHADER_irStatement *)0x0)) {
    pMVar1 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar1 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar1 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar1->ir).type = MOJOSHADER_IR_SEQ;
      (pMVar1->ir).filename = ctx->sourcefile;
      (pMVar1->ir).line = ctx->sourceline;
      (pMVar1->seq).first = first;
      (pMVar1->seq).next = next;
    }
  }
  return pMVar1;
}

Assistant:

static MOJOSHADER_irStatement *new_ir_seq(Context *ctx,
                                     MOJOSHADER_irStatement *first,
                                     MOJOSHADER_irStatement *next)
{
    assert((first != NULL) || (next != NULL));
    if (first == NULL)  // don't generate a SEQ if unnecessary.
        return next;
    else if (next == NULL)
        return first;

    NEW_IR_NODE(retval, MOJOSHADER_irSeq, MOJOSHADER_IR_SEQ);
    retval->first = first;
    retval->next = next;
    return (MOJOSHADER_irStatement *) retval;
}